

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O3

_xmlRegexp * xmlAutomataCompile(xmlAutomataPtr am)

{
  xmlRegexpPtr pxVar1;
  
  if ((am != (xmlAutomataPtr)0x0) && (am->error == 0)) {
    xmlFAEliminateEpsilonTransitions(am);
    if (am->error == 0) {
      pxVar1 = xmlRegEpxFromParse(am);
      return pxVar1;
    }
  }
  return (_xmlRegexp *)0x0;
}

Assistant:

xmlRegexpPtr
xmlAutomataCompile(xmlAutomataPtr am) {
    xmlRegexpPtr ret;

    if ((am == NULL) || (am->error != 0)) return(NULL);
    xmlFAEliminateEpsilonTransitions(am);
    if (am->error != 0)
        return(NULL);
    /* xmlFAComputesDeterminism(am); */
    ret = xmlRegEpxFromParse(am);

    return(ret);
}